

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

void duckdb::StringStats::Deserialize(Deserializer *deserializer,BaseStatistics *base)

{
  int iVar1;
  uint32_t uVar2;
  anon_union_40_2_2e033cff_for_stats_union *local_20;
  
  local_20 = &base->stats_union;
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"min");
  (*deserializer->_vptr_Deserializer[0x1b])(deserializer,&local_20,8);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_20 = (anon_union_40_2_2e033cff_for_stats_union *)((long)&base->stats_union + 8);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"max");
  (*deserializer->_vptr_Deserializer[0x1b])(deserializer,&local_20,8);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xca,"has_unicode");
  iVar1 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (base->stats_union).string_data.has_unicode = SUB41(iVar1,0);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"has_max_string_length");
  iVar1 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
  (base->stats_union).string_data.has_max_string_length = SUB41(iVar1,0);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcc,"max_string_length");
  uVar2 = (*deserializer->_vptr_Deserializer[0x13])(deserializer);
  (base->stats_union).string_data.max_string_length = uVar2;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  return;
}

Assistant:

void StringStats::Deserialize(Deserializer &deserializer, BaseStatistics &base) {
	auto &string_data = StringStats::GetDataUnsafe(base);
	deserializer.ReadProperty(200, "min", string_data.min, StringStatsData::MAX_STRING_MINMAX_SIZE);
	deserializer.ReadProperty(201, "max", string_data.max, StringStatsData::MAX_STRING_MINMAX_SIZE);
	deserializer.ReadProperty(202, "has_unicode", string_data.has_unicode);
	deserializer.ReadProperty(203, "has_max_string_length", string_data.has_max_string_length);
	deserializer.ReadProperty(204, "max_string_length", string_data.max_string_length);
}